

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::TextureSamplerCase::iterate(TextureSamplerCase *this)

{
  ostringstream *this_00;
  float *pfVar1;
  RenderContext *context;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  int x;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  deUint32 err;
  void *__s;
  void *__s_00;
  void *__s_01;
  long lVar10;
  short *psVar11;
  undefined4 extraout_var;
  short sVar12;
  int x_1;
  char *description;
  void *pvVar13;
  qpTestResult testResult;
  long lVar14;
  short *psVar15;
  undefined8 uVar16;
  short sVar17;
  short sVar18;
  void *pvVar19;
  value_type_conflict5 *__val;
  double dVar20;
  double dVar21;
  float fVar22;
  undefined1 auVar23 [16];
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Surface resultImage;
  Surface local_1d0;
  TextureFormat local_1b8;
  undefined1 local_1b0 [384];
  
  __s = operator_new(0x1e40);
  memset(__s,0,0x1e40);
  __s_00 = operator_new(0xf20);
  memset(__s_00,0,0xf20);
  __s_01 = operator_new(0x14ac);
  memset(__s_01,0,0x14ac);
  tcu::Surface::Surface(&local_1d0,0x100,0x100);
  auVar4 = _DAT_00b3d390;
  auVar3 = _DAT_00ae4630;
  lVar10 = 0;
  dVar20 = (double)DAT_00ae4630;
  dVar21 = DAT_00ae4630._8_8_;
  pvVar13 = __s;
  pvVar19 = __s_00;
  do {
    fVar22 = (float)(int)lVar10 / 21.0;
    fVar22 = fVar22 + fVar22 + -1.0;
    auVar23._4_4_ = 0;
    auVar23._0_4_ = (&(anonymous_namespace)::s_specialFloats)[lVar10];
    auVar23._8_4_ = (&(anonymous_namespace)::s_specialFloats)[lVar10];
    auVar23._12_4_ = 0;
    lVar14 = 0;
    uVar24 = 0x100000000;
    do {
      iVar6 = (int)(uVar24 >> 0x20);
      auVar25._0_8_ = uVar24 & 0xffffffff;
      auVar25._8_4_ = iVar6;
      auVar25._12_4_ = 0;
      auVar26._0_4_ = (float)(SUB168(auVar25 | auVar3,0) - dVar20);
      auVar26._4_4_ = (float)(SUB168(auVar25 | auVar3,8) - dVar21);
      auVar26._8_8_ = 0;
      auVar27 = divps(auVar26,auVar4);
      pfVar1 = (float *)((long)pvVar13 + lVar14 * 4 + 0x10);
      *pfVar1 = fVar22;
      pfVar1[1] = auVar27._4_4_ + auVar27._4_4_ + -1.0;
      pfVar1[2] = 0.0;
      pfVar1[3] = 1.0;
      pfVar1 = (float *)((long)pvVar13 + lVar14 * 4);
      *pfVar1 = fVar22;
      pfVar1[1] = auVar27._0_4_ + auVar27._0_4_ + -1.0;
      pfVar1[2] = 0.0;
      pfVar1[3] = 1.0;
      auVar28._0_12_ = ZEXT812(0);
      auVar28._12_4_ =
           (int)((ulong)*(undefined8 *)((long)&(anonymous_namespace)::s_specialFloats + lVar14) >>
                0x20);
      auVar27._4_8_ = auVar28._8_8_;
      auVar27._0_4_ = (int)*(undefined8 *)((long)&(anonymous_namespace)::s_specialFloats + lVar14);
      auVar27._12_4_ = 0;
      *(undefined1 (*) [16])((long)pvVar19 + lVar14 * 2) = auVar27 << 0x20 | auVar23;
      uVar24 = CONCAT44(iVar6 + 2,(int)uVar24 + 2);
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x58);
    lVar10 = lVar10 + 1;
    pvVar13 = (void *)((long)pvVar13 + 0x160);
    pvVar19 = (void *)((long)pvVar19 + 0xb0);
  } while (lVar10 != 0x16);
  psVar11 = (short *)((long)__s_01 + 10);
  sVar12 = 0;
  lVar10 = 0;
  do {
    lVar14 = -0x15;
    psVar15 = psVar11;
    do {
      sVar2 = (short)lVar14;
      sVar17 = sVar12 + sVar2 + 0x15;
      psVar15[-5] = sVar17;
      sVar18 = sVar12 + 0x2c + sVar2;
      psVar15[-4] = sVar18;
      psVar15[-3] = sVar12 + 0x2b + sVar2;
      psVar15[-2] = sVar17;
      psVar15[-1] = sVar18;
      *psVar15 = sVar12 + sVar2 + 0x16;
      psVar15 = psVar15 + 6;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0);
    lVar10 = lVar10 + 1;
    sVar12 = sVar12 + 0x16;
    psVar11 = psVar11 + 0x7e;
  } while (lVar10 != 0x15);
  local_1b0._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Drawing a textured grid with the shader. Sampling from the texture using special floating point values."
             ,0x67);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  iVar6 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar10 = CONCAT44(extraout_var,iVar6);
  uVar7 = (**(code **)(lVar10 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar8 = (**(code **)(lVar10 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_attr");
  uVar9 = (**(code **)(lVar10 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_sampler");
  (**(code **)(lVar10 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar10 + 0x188))(0x4000);
  (**(code **)(lVar10 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar10 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar10 + 0x14f0))(uVar9,0);
  uVar16 = 0xde1;
  if (this->m_testType == TEST_TEX_COORD_CUBE) {
    uVar16 = 0x8513;
  }
  (**(code **)(lVar10 + 0xb8))(uVar16,this->m_textureID);
  (**(code **)(lVar10 + 0x19f0))(uVar7,4,0x1406,0,0,__s);
  (**(code **)(lVar10 + 0x19f0))(uVar8,2,0x1406,0,0,__s_00);
  (**(code **)(lVar10 + 0x610))(uVar7);
  (**(code **)(lVar10 + 0x610))(uVar8);
  (**(code **)(lVar10 + 0x568))(4,0xa56,0x1403,__s_01);
  (**(code **)(lVar10 + 0x518))(uVar7);
  (**(code **)(lVar10 + 0x518))(uVar8);
  (**(code **)(lVar10 + 0x1680))(0);
  (**(code **)(lVar10 + 0x648))();
  err = (**(code **)(lVar10 + 0x800))();
  glu::checkError(err,"TextureSamplerCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x60a);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  local_1b8.order = RGBA;
  local_1b8.type = UNORM_INT8;
  if ((void *)local_1d0.m_pixels.m_cap != (void *)0x0) {
    local_1d0.m_pixels.m_cap = (size_t)local_1d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1b8,local_1d0.m_width,local_1d0.m_height,1,
             (void *)local_1d0.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  bVar5 = RenderCase::checkResultImage(&this->super_RenderCase,&local_1d0);
  if (bVar5) {
    bVar5 = RenderCase::drawTestPattern(&this->super_RenderCase,true);
    testResult = (qpTestResult)!bVar5;
    description = "test pattern failed";
    if (bVar5) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&local_1d0);
  operator_delete(__s_01,0x14ac);
  operator_delete(__s_00,0xf20);
  operator_delete(__s,0x1e40);
  return STOP;
}

Assistant:

TextureSamplerCase::IterateResult TextureSamplerCase::iterate (void)
{
	// Draw a grid and texture it with a texture and sample it using special special values. The result samples should all have the green channel at 255 as per the test image.

	std::vector<tcu::Vec4>	gridVertices	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<tcu::UVec2>	gridTexCoords	(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats));
	std::vector<deUint16>	indices			((DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const float posX = (float)x / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) - 1] to [-1, 1]
		const float posY = (float)y / ((float)DE_LENGTH_OF_ARRAY(s_specialFloats) - 1.0f) * 2.0f - 1.0f;

		gridVertices[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
		gridTexCoords[x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y]	= tcu::UVec2(s_specialFloats[x], s_specialFloats[y]);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) - 1; ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats) - 1) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * DE_LENGTH_OF_ARRAY(s_specialFloats) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a textured grid with the shader. Sampling from the texture using special floating point values." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				texCoordLoc	= gl.getAttribLocation(m_program->getProgram(), "a_attr");
		const GLint				samplerLoc	= gl.getUniformLocation(m_program->getProgram(), "u_sampler");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.uniform1i(samplerLoc, 0);
		if (m_testType != TEST_TEX_COORD_CUBE)
			gl.bindTexture(GL_TEXTURE_2D, m_textureID);
		else
			gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textureID);

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.vertexAttribPointer(texCoordLoc, 2, GL_FLOAT, GL_FALSE, 0, &gridTexCoords[0]);

		gl.enableVertexAttribArray(positionLoc);
		gl.enableVertexAttribArray(texCoordLoc);
		gl.drawElements(GL_TRIANGLES, (glw::GLsizei)(indices.size()), GL_UNSIGNED_SHORT, &indices[0]);
		gl.disableVertexAttribArray(positionLoc);
		gl.disableVertexAttribArray(texCoordLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn and samples were from the texture (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing and textures still works
	if (!drawTestPattern(true))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}